

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<const_char> * __thiscall
kj::Array<const_unsigned_char>::releaseAsChars
          (Array<const_char> *__return_storage_ptr__,Array<const_unsigned_char> *this)

{
  Array<const_unsigned_char> *this_local;
  Array<const_char> *result;
  
  Array<const_char>::Array(__return_storage_ptr__,(char *)this->ptr,this->size_,this->disposer);
  this->ptr = (uchar *)0x0;
  this->size_ = 0;
  return __return_storage_ptr__;
}

Assistant:

inline Array<PropagateConst<T, char>> releaseAsChars() {
    // Like asChars() but transfers ownership.
    static_assert(sizeof(T) == sizeof(PropagateConst<T, char>),
        "releaseAsChars() only possible on arrays with char-size elements (e.g. bytes).");
    Array<PropagateConst<T, char>> result(
        reinterpret_cast<PropagateConst<T, char>*>(ptr), size_, *disposer);
    ptr = nullptr;
    size_ = 0;
    return result;
  }